

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::ConcurrentSSBOAtomicCounterMixedCase::
genSSBOComputeSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  _anonymous_namespace_ *this_00;
  ostream *poVar1;
  Context *context;
  char *in_RCX;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream buf;
  ConcurrentSSBOAtomicCounterMixedCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"${GLSL_VERSION_DECL}\n");
  poVar1 = std::operator<<(poVar1,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  poVar1 = std::operator<<(poVar1,"layout (binding = 1, std430) volatile buffer WorkBuffer\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\thighp uint targetValue;\n");
  poVar1 = std::operator<<(poVar1,"\thighp uint dummy;\n");
  poVar1 = std::operator<<(poVar1,"} sb_work;\n");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"void main ()\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"\t// flip high bits\n");
  poVar1 = std::operator<<(poVar1,
                           "\thighp uint mask = uint(1) << (24u + (gl_GlobalInvocationID.x % 8u));\n"
                          );
  poVar1 = std::operator<<(poVar1,"\tsb_work.dummy = atomicXor(sb_work.targetValue, mask);\n");
  std::operator<<(poVar1,"}");
  this_00 = *(_anonymous_namespace_ **)((long)this + 0x70);
  std::__cxx11::ostringstream::str();
  context = (Context *)std::__cxx11::string::c_str();
  specializeShader_abi_cxx11_(__return_storage_ptr__,this_00,context,in_RCX);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string ConcurrentSSBOAtomicCounterMixedCase::genSSBOComputeSource (void) const
{
	std::ostringstream buf;

	buf	<< "${GLSL_VERSION_DECL}\n"
		<< "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		<< "layout (binding = 1, std430) volatile buffer WorkBuffer\n"
		<< "{\n"
		<< "	highp uint targetValue;\n"
		<< "	highp uint dummy;\n"
		<< "} sb_work;\n"
		<< "\n"
		<< "void main ()\n"
		<< "{\n"
		<< "	// flip high bits\n"
		<< "	highp uint mask = uint(1) << (24u + (gl_GlobalInvocationID.x % 8u));\n"
		<< "	sb_work.dummy = atomicXor(sb_work.targetValue, mask);\n"
		<< "}";

	return specializeShader(m_context, buf.str().c_str());
}